

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O0

string * base64_decode(string *__return_storage_ptr__,string *encoded_string)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  uchar *puVar4;
  int iVar5;
  bool local_51;
  char local_2f [7];
  int iStack_28;
  uchar char_array_3 [3];
  uchar char_array_4 [4];
  int in_;
  int j;
  int i;
  int in_len;
  string *encoded_string_local;
  string *ret;
  
  j = std::__cxx11::string::size();
  in_ = 0;
  iStack_28 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  while( true ) {
    iVar2 = j + -1;
    local_51 = false;
    if (j != 0) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)encoded_string);
      local_51 = false;
      if (*pcVar3 != '=') {
        puVar4 = (uchar *)std::__cxx11::string::operator[]((ulong)encoded_string);
        local_51 = is_base64(*puVar4);
      }
    }
    if (local_51 == false) break;
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)encoded_string);
    iVar5 = in_ + 1;
    local_2f[(long)in_ + 3] = *pcVar3;
    iStack_28 = iStack_28 + 1;
    in_ = iVar5;
    j = iVar2;
    if (iVar5 == 4) {
      for (in_ = 0; in_ < 4; in_ = in_ + 1) {
        cVar1 = std::__cxx11::string::find(-8,(ulong)(uint)(int)local_2f[(long)in_ + 3]);
        local_2f[(long)in_ + 3] = cVar1;
      }
      local_2f[0] = local_2f[3] * '\x04' + (char)((int)((byte)local_2f[4] & 0x30) >> 4);
      local_2f[1] = local_2f[4] * '\x10' + (char)((int)((byte)local_2f[5] & 0x3c) >> 2);
      local_2f[2] = local_2f[5] * '@' + local_2f[6];
      for (in_ = 0; in_ < 3; in_ = in_ + 1) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_2f[in_]);
      }
      in_ = 0;
    }
  }
  if (in_ != 0) {
    char_array_4[0] = (undefined1)in_;
    char_array_4[1] = in_._1_1_;
    char_array_4[2] = in_._2_1_;
    char_array_4[3] = in_._3_1_;
    for (; (int)char_array_4 < 4; char_array_4 = (uchar  [4])((int)char_array_4 + 1)) {
      local_2f[(long)(int)char_array_4 + 3] = '\0';
    }
    char_array_4[0] = '\0';
    char_array_4[1] = '\0';
    char_array_4[2] = '\0';
    char_array_4[3] = '\0';
    for (; (int)char_array_4 < 4; char_array_4 = (uchar  [4])((int)char_array_4 + 1)) {
      cVar1 = std::__cxx11::string::find(-8,(ulong)(uint)(int)local_2f[(long)(int)char_array_4 + 3])
      ;
      local_2f[(long)(int)char_array_4 + 3] = cVar1;
    }
    local_2f[0] = local_2f[3] * '\x04' + (char)((int)((byte)local_2f[4] & 0x30) >> 4);
    local_2f[1] = local_2f[4] * '\x10' + (char)((int)((byte)local_2f[5] & 0x3c) >> 2);
    local_2f[2] = local_2f[5] * '@' + local_2f[6];
    char_array_4[0] = '\0';
    char_array_4[1] = '\0';
    char_array_4[2] = '\0';
    char_array_4[3] = '\0';
    for (; (int)char_array_4 < in_ + -1; char_array_4 = (uchar  [4])((int)char_array_4 + 1)) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_2f[(int)char_array_4])
      ;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string base64_decode(std::string const& encoded_string) {
  int in_len = encoded_string.size();
  int i = 0;
  int j = 0;
  int in_ = 0;
  unsigned char char_array_4[4], char_array_3[3];
  std::string ret;

  while (in_len-- && ( encoded_string[in_] != '=') && is_base64(encoded_string[in_])) {
    char_array_4[i++] = encoded_string[in_]; in_++;
    if (i ==4) {
      for (i = 0; i <4; i++)
        char_array_4[i] = base64_chars.find(char_array_4[i]);

      char_array_3[0] = (char_array_4[0] << 2) + ((char_array_4[1] & 0x30) >> 4);
      char_array_3[1] = ((char_array_4[1] & 0xf) << 4) + ((char_array_4[2] & 0x3c) >> 2);
      char_array_3[2] = ((char_array_4[2] & 0x3) << 6) + char_array_4[3];

      for (i = 0; (i < 3); i++)
        ret += char_array_3[i];
      i = 0;
    }
  }

  if (i) {
    for (j = i; j <4; j++)
      char_array_4[j] = 0;

    for (j = 0; j <4; j++)
      char_array_4[j] = base64_chars.find(char_array_4[j]);

    char_array_3[0] = (char_array_4[0] << 2) + ((char_array_4[1] & 0x30) >> 4);
    char_array_3[1] = ((char_array_4[1] & 0xf) << 4) + ((char_array_4[2] & 0x3c) >> 2);
    char_array_3[2] = ((char_array_4[2] & 0x3) << 6) + char_array_4[3];

    for (j = 0; (j < i - 1); j++) ret += char_array_3[j];
  }

  return ret;
}